

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O1

void __thiscall
Annotator_assignImportSourceIdBadInput_Test::TestBody
          (Annotator_assignImportSourceIdBadInput_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  ImportSourcePtr nullImportSource;
  AnnotatorPtr annotator;
  AssertHelper local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined8 local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_10;
  
  libcellml::Annotator::create();
  local_28 = 0;
  p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_58);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            (local_38,"\"\"","annotator->assignId(nullImportSource)",(char (*) [1])0x168c1a,
             &local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_30.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x494,pcVar2);
    testing::internal::AssertHelper::operator=(local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_60);
    if ((long *)local_58._M_dataplus._M_p != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((long *)local_58._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_58._M_dataplus._M_p + 8))();
      }
      local_58._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
  }
  if (local_10 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_10);
  }
  return;
}

Assistant:

TEST(Annotator, assignImportSourceIdBadInput)
{
    auto annotator = libcellml::Annotator::create();
    libcellml::ImportSourcePtr nullImportSource = nullptr;
    EXPECT_EQ("", annotator->assignId(nullImportSource));
}